

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

void __thiscall
VmaVirtualBlock_T::CalculateDetailedStatistics
          (VmaVirtualBlock_T *this,VmaDetailedStatistics *outStats)

{
  *(undefined8 *)((long)&(outStats->statistics).blockBytes + 4) = 0;
  *(undefined8 *)((long)&(outStats->statistics).allocationBytes + 4) = 0;
  (outStats->statistics).blockCount = 0;
  (outStats->statistics).allocationCount = 0;
  (outStats->statistics).blockBytes = 0;
  outStats->allocationSizeMin = 0xffffffffffffffff;
  outStats->allocationSizeMax = 0;
  outStats->unusedRangeSizeMin = 0xffffffffffffffff;
  outStats->unusedRangeSizeMax = 0;
  (*this->m_Metadata->_vptr_VmaBlockMetadata[0xe])();
  return;
}

Assistant:

static void VmaClearDetailedStatistics(VmaDetailedStatistics& outStats)
{
    VmaClearStatistics(outStats.statistics);
    outStats.unusedRangeCount = 0;
    outStats.allocationSizeMin = VK_WHOLE_SIZE;
    outStats.allocationSizeMax = 0;
    outStats.unusedRangeSizeMin = VK_WHOLE_SIZE;
    outStats.unusedRangeSizeMax = 0;
}